

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void os_plain(void)

{
  int iVar1;
  
  os_f_plain = 1;
  iVar1 = oss_eof_on_stdin();
  if (iVar1 != 0) {
    G_os_moremode = 0;
  }
  return;
}

Assistant:

void os_plain(void)
{
    /* set the 'plain' mode flag */
    os_f_plain = 1;

    /* 
     *   if we're running without a stdin, turn off pagination - since the
     *   user won't be able to respond to [more] prompts, there's no reason
     *   to show them 
     */
    if (oss_eof_on_stdin())
        G_os_moremode = FALSE;
}